

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::createBasket(Farm *this)

{
  bool bVar1;
  ostream *poVar2;
  Basket basket;
  int nif;
  double weight;
  allocator local_75;
  int local_74;
  string local_70;
  double local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  undefined1 local_20 [12];
  
  std::__cxx11::string::string((string *)&local_70,"Enter client\'s nif: ",&local_75);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_74,&local_70,(function<bool_(int)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = searchClientByNIF(this,local_74);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"Enter basket weight: ",&local_75);
    getDouble(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    Basket::Basket((Basket *)local_20,local_50,local_74);
    basket._12_4_ = 0;
    basket.weight = (double)local_20._0_8_;
    basket.client_nif = local_20._8_4_;
    addBasket(this,basket);
    this->clientsFileChanged = true;
    poVar2 = std::operator<<((ostream *)&std::cout,"Basket successfully created!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_70,"ENTER to go back",&local_75);
    enterWait(&local_70);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_70,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!",
               &local_75);
    cinERR(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"ENTER to go back",&local_75);
    enterWait(&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void Farm::createBasket() {
    int nif;
    double weight;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    getDouble(weight, "Enter basket weight: ");

    addBasket(Basket(weight, nif));

    clientsFileChanged = true;
    cout << "Basket successfully created!" << endl;
    enterWait();
}